

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

void __thiscall w3Module::read_memory(w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  ulong uVar2;
  w3Limits wVar3;
  string local_40;
  
  puts("reading section5");
  uVar1 = ::read_varuint32(cursor,this->end);
  uVar2 = (ulong)uVar1;
  if (1 < uVar1) {
    StringFormat_abi_cxx11_(&local_40,"%lX",uVar2);
    AssertFailedFormat("size <= 1",&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  for (; uVar2 != 0; uVar2 = uVar2 - 1) {
    wVar3 = read_limits(this,cursor);
    (this->memory_limits).min = (int)wVar3._0_8_;
    (this->memory_limits).max = (int)((ulong)wVar3._0_8_ >> 0x20);
    (this->memory_limits).hasMax = wVar3.hasMax;
  }
  printf("read section5 min:%X hasMax:%X max:%X\n",(ulong)(this->memory_limits).min,
         (ulong)(this->memory_limits).hasMax,(ulong)(this->memory_limits).max);
  return;
}

Assistant:

void w3Module::read_memory (uint8_t** cursor)
{
    printf ("reading section5\n");
    const size_t size = read_varuint32 (cursor);
    AssertFormat (size <= 1, ("%" FORMAT_SIZE "X", size)); // FUTURE
    for (size_t i = 0; i < size; ++i)
        memory_limits = read_limits (cursor);
    printf ("read section5 min:%X hasMax:%X max:%X\n", memory_limits.min, memory_limits.hasMax, memory_limits.max);
}